

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O3

bool __thiscall tinyusdz::primvar::PrimVar::is_timesamples(PrimVar *this)

{
  vtable_type *pvVar1;
  uint32_t uVar2;
  
  if (this->_blocked != false) {
    return false;
  }
  pvVar1 = (this->_value).v_.vtable;
  if ((pvVar1 != (vtable_type *)0x0) &&
     ((uVar2 = (*pvVar1->type_id)(), uVar2 == 0 ||
      ((pvVar1 = (this->_value).v_.vtable, pvVar1 != (vtable_type *)0x0 &&
       (uVar2 = (*pvVar1->type_id)(), uVar2 == 1)))))) {
    return (this->_ts)._samples.
           super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
           ._M_impl.super__Vector_impl_data._M_finish !=
           (this->_ts)._samples.
           super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
           ._M_impl.super__Vector_impl_data._M_start;
  }
  return false;
}

Assistant:

bool has_value() const {
    // ValueBlock is treated as having a value.
    if (_blocked) {
      return true;
    }
    return (_value.type_id() != value::TypeId::TYPE_ID_INVALID) && (_value.type_id() != value::TypeId::TYPE_ID_NULL);
  }